

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O0

void __thiscall
MeshSplitter::UpdateNode
          (MeshSplitter *this,aiNode *pcNode,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *source_mesh_map)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint *puVar4;
  reference pvVar5;
  uint local_58;
  uint end_1;
  uint i_1;
  uint b;
  uint end;
  uint a;
  uint i;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aiEntries;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *source_mesh_map_local;
  aiNode *pcNode_local;
  MeshSplitter *this_local;
  
  aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)source_mesh_map;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
             (ulong)(pcNode->mNumMeshes + 1));
  for (end = 0; end < pcNode->mNumMeshes; end = end + 1) {
    b = 0;
    sVar2 = std::
            vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
            ::size((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    *)aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    for (; b < (uint)sVar2; b = b + 1) {
      pvVar3 = std::
               vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                             *)aiEntries.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)b);
      if (pvVar3->second == pcNode->mMeshes[end]) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,&b);
      }
    }
  }
  if (pcNode->mMeshes != (uint *)0x0) {
    operator_delete(pcNode->mMeshes,4);
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  pcNode->mNumMeshes = (uint)sVar2;
  puVar4 = (uint *)operator_new__((ulong)pcNode->mNumMeshes << 2);
  pcNode->mMeshes = puVar4;
  for (end_1 = 0; end_1 < pcNode->mNumMeshes; end_1 = end_1 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)end_1
                       );
    pcNode->mMeshes[end_1] = *pvVar5;
  }
  local_58 = 0;
  uVar1 = pcNode->mNumChildren;
  for (; local_58 < uVar1; local_58 = local_58 + 1) {
    UpdateNode(this,pcNode->mChildren[local_58],
               (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                *)aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return;
}

Assistant:

void MeshSplitter::UpdateNode(aiNode* pcNode, const std::vector<std::pair<aiMesh*, unsigned int> >& source_mesh_map) {
	// TODO: should better use std::(multi)set for source_mesh_map.

	// for every index in out list build a new entry
	std::vector<unsigned int> aiEntries;
	aiEntries.reserve(pcNode->mNumMeshes + 1);
	for (unsigned int i = 0; i < pcNode->mNumMeshes;++i)	{
		for (unsigned int a = 0, end = static_cast<unsigned int>(source_mesh_map.size()); a < end;++a)	{
			if (source_mesh_map[a].second == pcNode->mMeshes[i])	{
				aiEntries.push_back(a);
			}
		}
	}

	// now build the new list
	delete pcNode->mMeshes;
	pcNode->mNumMeshes = static_cast<unsigned int>(aiEntries.size());
	pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];

	for (unsigned int b = 0; b < pcNode->mNumMeshes;++b) {
		pcNode->mMeshes[b] = aiEntries[b];
	}

	// recursively update children
	for (unsigned int i = 0, end = pcNode->mNumChildren; i < end;++i)	{
		UpdateNode ( pcNode->mChildren[i], source_mesh_map );
	}
	return;
}